

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O3

ngx_int_t ngx_http_variable_sent_content_length
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_table_elt_t *pnVar1;
  u_char *buf;
  u_char *puVar2;
  
  pnVar1 = (r->headers_out).content_length;
  if (pnVar1 == (ngx_table_elt_t *)0x0) {
    if (-1 < (r->headers_out).content_length_n) {
      buf = (u_char *)ngx_pnalloc(r->pool,0x14);
      if (buf != (u_char *)0x0) {
        puVar2 = ngx_sprintf(buf,"%O",(r->headers_out).content_length_n);
        *(uint *)v = ((int)puVar2 - (int)buf & 0xfffffffU) + (*(uint *)v & 0x80000000) + 0x10000000;
        v->data = buf;
        return 0;
      }
      return -1;
    }
    v->field_0x3 = v->field_0x3 | 0x40;
  }
  else {
    *(uint *)v = (*(uint *)v & 0x80000000) + ((uint)(pnVar1->value).len & 0xfffffff) + 0x10000000;
    v->data = (((r->headers_out).content_length)->value).data;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_sent_content_length(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char  *p;

    if (r->headers_out.content_length) {
        v->len = r->headers_out.content_length->value.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = r->headers_out.content_length->value.data;

        return NGX_OK;
    }

    if (r->headers_out.content_length_n >= 0) {
        p = ngx_pnalloc(r->pool, NGX_OFF_T_LEN);
        if (p == NULL) {
            return NGX_ERROR;
        }

        v->len = ngx_sprintf(p, "%O", r->headers_out.content_length_n) - p;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = p;

        return NGX_OK;
    }

    v->not_found = 1;

    return NGX_OK;
}